

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O0

PacketBuilder * __thiscall PacketBuilder::AddInt(PacketBuilder *this,int num)

{
  pointer pvVar1;
  array<unsigned_char,_4UL> local_18;
  int local_14;
  PacketBuilder *pPStack_10;
  int num_local;
  PacketBuilder *this_local;
  
  local_14 = num;
  pPStack_10 = this;
  local_18 = PacketProcessor::ENumber(num);
  pvVar1 = std::array<unsigned_char,_4UL>::data(&local_18);
  std::__cxx11::string::append((char *)&this->data,(ulong)pvVar1);
  return this;
}

Assistant:

PacketBuilder &PacketBuilder::AddInt(int num)
{
#ifdef DEBUG
	std::size_t capacity_before = this->Capacity();
#endif

	this->data.append((char *)PacketProcessor::ENumber(static_cast<unsigned>(num)).data(), 4);

#ifdef DEBUG
	if (this->data.length() > capacity_before)
		debug_packetbuilder_overflow(this, capacity_before);
#endif

	return *this;
}